

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t archive_read_format_lha_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  byte bVar2;
  lha *lha;
  uint16_t uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint uVar6;
  uchar *p;
  char *pcVar7;
  void *pvVar8;
  size_t sVar9;
  char *pcVar10;
  ushort *pp;
  short *pp_00;
  byte *pbVar11;
  time_t tVar12;
  ulong uVar13;
  size_t n;
  int *piVar14;
  size_t sVar15;
  mode_t mVar16;
  ushort uVar17;
  int iVar18;
  ulong uVar19;
  void *pvVar20;
  long request;
  byte bVar21;
  void *h;
  bool bVar22;
  size_t extdsize;
  uint16_t header_crc;
  archive_string local_78;
  archive_string local_58;
  archive_string *local_40;
  void *local_38;
  
  (a->archive).archive_format = 0xb0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "lha";
  }
  lha = (lha *)a->format->data;
  lha->decompress_init = '\0';
  lha->end_of_entry = '\0';
  lha->end_of_entry_cleanup = '\0';
  lha->entry_unconsumed = 0;
  pcVar7 = (char *)__archive_read_ahead(a,0x16,(ssize_t *)0x0);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
    if (pcVar7 == (char *)0x0) {
      return L'\x01';
    }
    if (*pcVar7 == '\0') {
      return L'\x01';
    }
    goto LAB_00206bba;
  }
  if (((lha->found_first_header == '\0') && (*pcVar7 == 'M')) && (pcVar7[1] == 'Z')) {
    uVar19 = 0x1000;
    do {
      while (pvVar8 = __archive_read_ahead(a,uVar19,(ssize_t *)&local_78), pvVar8 != (void *)0x0) {
        if ((long)local_78.s < 0x16) goto LAB_00206b75;
        pvVar20 = pvVar8;
        if (local_78.s != (char *)0x16) {
          pcVar7 = local_78.s + (long)pvVar8;
          h = pvVar8;
          do {
            sVar9 = lha_check_header_format(h);
            if (sVar9 == 0) {
              __archive_read_consume(a,(long)h - (long)pvVar8);
              bVar22 = false;
              wVar4 = L'\0';
              goto LAB_00206bd5;
            }
            pvVar20 = (void *)((long)h + sVar9);
            pcVar10 = (char *)((long)h + sVar9 + 0x16);
            h = pvVar20;
          } while (pcVar10 < pcVar7);
        }
        __archive_read_consume(a,(long)pvVar20 - (long)pvVar8);
      }
      bVar22 = 0x31 < uVar19;
      uVar19 = uVar19 >> 1;
    } while (bVar22);
LAB_00206b75:
    archive_set_error(&a->archive,0x54,"Couldn\'t find out LHa header");
    wVar4 = L'\xffffffe2';
    bVar22 = true;
LAB_00206bd5:
    if (bVar22) {
      return wVar4;
    }
    pcVar7 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
    if (pcVar7 == (char *)0x0) goto LAB_00206bba;
  }
  if (*pcVar7 == '\0') {
    return L'\x01';
  }
  sVar9 = lha_check_header_format(pcVar7);
  if (sVar9 != 0) {
    pcVar7 = "Bad LHa file";
    goto LAB_00206c14;
  }
  lha->found_first_header = '\x01';
  lha->header_size = 0;
  lha->level = pcVar7[0x14];
  lha->method[0] = pcVar7[3];
  lha->method[1] = pcVar7[4];
  cVar1 = pcVar7[5];
  lha->method[2] = cVar1;
  uVar17 = *(ushort *)lha->method ^ 0x686c;
  lha->directory = cVar1 == 'd' && uVar17 == 0;
  if (cVar1 == '0' && uVar17 == 0) {
    bVar22 = false;
  }
  else {
    bVar22 = lha->method[2] != '4' || *(short *)lha->method != 0x7a6c;
  }
  lha->entry_is_compressed = bVar22;
  lha->compsize = 0;
  lha->origsize = 0;
  lha->setflag = 0;
  lha->birthtime = 0;
  lha->birthtime_tv_nsec = 0;
  lha->mtime = 0;
  lha->mtime_tv_nsec = 0;
  lha->atime = 0;
  lha->atime_tv_nsec = 0;
  mVar16 = 0x1ff;
  if (lha->directory == '\0') {
    mVar16 = 0x1b6;
  }
  lha->mode = mVar16;
  (lha->dirname).length = 0;
  local_40 = &lha->filename;
  (lha->filename).length = 0;
  lha->dos_attr = '\0';
  lha->uid = 0;
  lha->gid = 0;
  lha->sconv = lha->opt_sconv;
  switch(pcVar7[0x14]) {
  case '\0':
    pbVar11 = (byte *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
    if (pbVar11 == (byte *)0x0) {
LAB_00207017:
      pcVar10 = "Truncated LHa header";
      goto LAB_0020701e;
    }
    lha->header_size = (ulong)*pbVar11 + 2;
    bVar2 = pbVar11[1];
    lha->compsize = (ulong)*(uint *)(pbVar11 + 7);
    lha->origsize = (ulong)*(uint *)(pbVar11 + 0xb);
    tVar12 = lha_dos_time(pbVar11 + 0xf);
    lha->mtime = tVar12;
    bVar21 = pbVar11[0x15];
    uVar19 = (ulong)bVar21;
    iVar18 = ((int)lha->header_size - (uint)bVar21) + -0x18;
    if (iVar18 != -2 && (iVar18 < 0 || 0xdd < bVar21)) {
      pcVar10 = "Invalid LHa header";
      goto LAB_0020701e;
    }
    pvVar8 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
    if (pvVar8 == (void *)0x0) {
LAB_0020752b:
      pcVar10 = "Truncated LHa header";
      goto LAB_00207532;
    }
    (lha->filename).length = 0;
    local_38 = (void *)((long)pvVar8 + 0x16);
    archive_strncat(local_40,local_38,uVar19);
    if (-1 < iVar18) {
      lha->crc = *(uint16_t *)((long)local_38 + uVar19);
      *(byte *)&lha->setflag = (byte)lha->setflag | 8;
    }
    sVar9 = lha->header_size;
    if (sVar9 == 2) {
      bVar21 = 0;
    }
    else {
      sVar15 = 2;
      bVar21 = 0;
      do {
        bVar21 = bVar21 + *(char *)((long)pvVar8 + sVar15);
        sVar15 = sVar15 + 1;
      } while (sVar9 != sVar15);
    }
    if (((0 < iVar18) && (*(char *)((long)pvVar8 + uVar19 + 0x18) == 'U')) && (iVar18 == 0xc)) {
      lha->mtime = (ulong)*(uint *)((long)pvVar8 + uVar19 + 0x1a);
      lha->mode = (uint)*(ushort *)((long)pvVar8 + uVar19 + 0x1e);
      lha->uid = (ulong)*(ushort *)((long)pvVar8 + uVar19 + 0x20);
      lha->gid = (ulong)*(ushort *)((long)pvVar8 + uVar19 + 0x22);
      *(byte *)&lha->setflag = (byte)lha->setflag | 4;
    }
    __archive_read_consume(a,sVar9);
    wVar4 = L'\0';
    if (bVar21 == bVar2) break;
LAB_00207623:
    pcVar10 = "LHa header sum error";
    iVar18 = -1;
    goto LAB_00207026;
  case '\x01':
    pbVar11 = (byte *)__archive_read_ahead(a,0x1b,(ssize_t *)0x0);
    if (pbVar11 == (byte *)0x0) goto LAB_00207017;
    lha->header_size = (ulong)*pbVar11 + 2;
    bVar2 = pbVar11[1];
    lha->compsize = (ulong)*(uint *)(pbVar11 + 7);
    lha->origsize = (ulong)*(uint *)(pbVar11 + 0xb);
    tVar12 = lha_dos_time(pbVar11 + 0xf);
    lha->mtime = tVar12;
    bVar21 = pbVar11[0x15];
    uVar19 = (ulong)bVar21;
    if ((bVar21 < 0xe7) && ((int)(uint)bVar21 <= (int)lha->header_size + -0x1b)) {
      pvVar8 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
      if (pvVar8 == (void *)0x0) goto LAB_0020752b;
      pvVar20 = (void *)((long)pvVar8 + 0x16);
      if (uVar19 != 0) {
        uVar13 = 0;
        do {
          if (*(char *)((long)pvVar20 + uVar13) == -1) goto LAB_0020723f;
          uVar13 = uVar13 + 1;
        } while (uVar19 != uVar13);
      }
      (lha->filename).length = 0;
      archive_strncat(local_40,pvVar20,uVar19);
      lha->crc = *(uint16_t *)((long)pvVar20 + uVar19);
      *(byte *)&lha->setflag = (byte)lha->setflag | 8;
      request = lha->header_size - 2;
      if (request == 0) {
        bVar21 = 0;
      }
      else {
        sVar9 = 2;
        bVar21 = 0;
        do {
          bVar21 = bVar21 + *(char *)((long)pvVar8 + sVar9);
          sVar9 = sVar9 + 1;
        } while (lha->header_size != sVar9);
      }
      __archive_read_consume(a,request);
      wVar4 = lha_read_file_extended_header
                        (a,lha,(uint16_t *)0x0,L'\x02',lha->compsize + 2,(size_t *)&local_78);
      if (L'\xffffffeb' < wVar4) {
        lha->compsize = (lha->compsize - (long)local_78.s) + 2;
        if (bVar21 != bVar2) goto LAB_00207623;
        wVar4 = wVar4 & wVar4 >> 0x1f;
      }
    }
    else {
LAB_0020723f:
      pcVar10 = "Invalid LHa header";
LAB_00207532:
      archive_set_error(&a->archive,0x54,pcVar10);
      wVar4 = L'\xffffffe2';
    }
    break;
  case '\x02':
    pp = (ushort *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
    pcVar10 = "Truncated LHa header";
    if (pp != (ushort *)0x0) {
      uVar17 = *pp;
      lha->header_size = (ulong)uVar17;
      lha->compsize = (ulong)*(uint *)((long)pp + 7);
      lha->origsize = (ulong)*(uint *)((long)pp + 0xb);
      lha->mtime = (ulong)*(uint *)((long)pp + 0xf);
      lha->crc = *(uint16_t *)((long)pp + 0x15);
      *(byte *)&lha->setflag = (byte)lha->setflag | 8;
      if ((ulong)uVar17 < 0x18) {
        pcVar10 = "Invalid LHa header size";
      }
      else {
        uVar3 = lha_crc16(0,pp,0x18);
        local_58.s = (char *)CONCAT62(local_58.s._2_6_,uVar3);
        __archive_read_consume(a,0x18);
        wVar4 = lha_read_file_extended_header
                          (a,lha,(uint16_t *)&local_58,L'\x02',lha->header_size - 0x18,
                           (size_t *)&local_78);
        if (wVar4 < L'\xffffffec') break;
        uVar6 = ((int)lha->header_size - (int)local_78.s) - 0x18;
        if (0 < (int)uVar6) {
          uVar19 = (ulong)uVar6;
          pvVar8 = __archive_read_ahead(a,uVar19,(ssize_t *)0x0);
          if (pvVar8 == (void *)0x0) goto LAB_00206e2a;
          uVar3 = lha_crc16((uint16_t)local_58.s,pvVar8,uVar19);
          local_58.s = (char *)CONCAT62(local_58.s._2_6_,uVar3);
          __archive_read_consume(a,uVar19);
        }
        if ((uint16_t)local_58.s == lha->header_crc) break;
        pcVar10 = "LHa header CRC error";
      }
    }
LAB_00206e2a:
    archive_set_error(&a->archive,0x54,pcVar10);
    wVar4 = L'\xffffffe2';
    break;
  case '\x03':
    pp_00 = (short *)__archive_read_ahead(a,0x1c,(ssize_t *)0x0);
    if (pp_00 == (short *)0x0) goto LAB_00207017;
    pcVar10 = "Invalid LHa header";
    if (*pp_00 == 4) {
      uVar6 = *(uint *)(pp_00 + 0xc);
      lha->header_size = (ulong)uVar6;
      lha->compsize = (ulong)*(uint *)((long)pp_00 + 7);
      lha->origsize = (ulong)*(uint *)((long)pp_00 + 0xb);
      lha->mtime = (ulong)*(uint *)((long)pp_00 + 0xf);
      lha->crc = *(uint16_t *)((long)pp_00 + 0x15);
      *(byte *)&lha->setflag = (byte)lha->setflag | 8;
      if (0x1f < (ulong)uVar6) {
        uVar3 = lha_crc16(0,pp_00,0x1c);
        local_58.s = (char *)CONCAT62(local_58.s._2_6_,uVar3);
        __archive_read_consume(a,0x1c);
        wVar4 = lha_read_file_extended_header
                          (a,lha,(uint16_t *)&local_58,L'\x04',lha->header_size - 0x1c,
                           (size_t *)&local_78);
        if ((wVar4 < L'\xffffffec') || ((uint16_t)local_58.s == lha->header_crc)) break;
        pcVar10 = "LHa header CRC error";
      }
    }
LAB_0020701e:
    iVar18 = 0x54;
LAB_00207026:
    archive_set_error(&a->archive,iVar18,pcVar10);
LAB_00207045:
    wVar4 = L'\xffffffe2';
    break;
  default:
    archive_set_error(&a->archive,0x54,"Unsupported LHa header level %d");
    goto LAB_00207045;
  }
  if (wVar4 < L'\xffffffec') {
    return wVar4;
  }
  if ((lha->directory == '\0') && ((lha->filename).length == 0)) {
LAB_00206bba:
    pcVar7 = "Truncated LHa header";
LAB_00206c14:
    iVar18 = 0x54;
    goto LAB_00206c1c;
  }
  archive_string_concat(&lha->dirname,local_40);
  local_58.s = (char *)0x0;
  local_58.buffer_length = 0;
  local_78.s = (char *)0x0;
  local_78.length = 0;
  local_78.buffer_length = 0;
  local_58.length = 0;
  archive_string_concat(&local_58,&lha->dirname);
  if ((lha->mode & 0xf000) == 0xa000) {
    pcVar10 = strchr(local_58.s,0x7c);
    if (pcVar10 == (char *)0x0) {
      archive_set_error(&a->archive,0x54,"Unknown symlink-name");
      archive_string_free(&local_58);
      archive_string_free(&local_78);
      return L'\xffffffe7';
    }
    n = strlen(pcVar10 + 1);
    local_78.length = 0;
    archive_strncat(&local_78,pcVar10 + 1,n);
    *pcVar10 = '\0';
    local_58.length = strlen(local_58.s);
  }
  else {
    lha->mode = (lha->mode & 0xffff0fff) + (uint)(lha->directory == '\0') * 0x4000 + 0x4000;
  }
  if (((lha->setflag & 4) == 0) && ((lha->dos_attr & 1) != 0)) {
    *(byte *)&lha->mode = (byte)lha->mode & 0x6d;
  }
  wVar5 = _archive_entry_copy_pathname_l(entry,local_58.s,local_58.length,lha->sconv);
  if (wVar5 == L'\0') {
LAB_002071aa:
    archive_string_free(&local_58);
    if (local_78.length == 0) {
      archive_entry_set_symlink(entry,(char *)0x0);
LAB_002073b4:
      archive_string_free(&local_78);
      if (pcVar7[0x14] == '\0') {
        lha_replace_path_separator(lha,entry);
      }
      archive_entry_set_mode(entry,lha->mode);
      archive_entry_set_uid(entry,lha->uid);
      archive_entry_set_gid(entry,lha->gid);
      if ((lha->uname).length != 0) {
        archive_entry_set_uname(entry,(lha->uname).s);
      }
      if ((lha->gname).length != 0) {
        archive_entry_set_gname(entry,(lha->gname).s);
      }
      if ((lha->setflag & 1) == 0) {
        archive_entry_unset_birthtime(entry);
        archive_entry_unset_ctime(entry);
      }
      else {
        archive_entry_set_birthtime(entry,lha->birthtime,lha->birthtime_tv_nsec);
        archive_entry_set_ctime(entry,lha->birthtime,lha->birthtime_tv_nsec);
      }
      archive_entry_set_mtime(entry,lha->mtime,lha->mtime_tv_nsec);
      if ((lha->setflag & 2) == 0) {
        archive_entry_unset_atime(entry);
      }
      else {
        archive_entry_set_atime(entry,lha->atime,lha->atime_tv_nsec);
      }
      if ((lha->directory == '\0') && (pcVar7 = archive_entry_symlink(entry), pcVar7 == (char *)0x0)
         ) {
        archive_entry_set_size(entry,lha->origsize);
      }
      else {
        archive_entry_unset_size(entry);
      }
      lha->entry_bytes_remaining = lha->compsize;
      lha->entry_offset = 0;
      lha->entry_crc_calculated = 0;
      if (lha->compsize == 0 || lha->directory != '\0') {
        lha->end_of_entry = '\x01';
      }
      sprintf(lha->format_name,"lha -%c%c%c-",(ulong)(uint)(int)lha->method[0],
              (ulong)(uint)(int)lha->method[1],(ulong)(uint)(int)lha->method[2]);
      (a->archive).archive_format_name = lha->format_name;
      return wVar4;
    }
    wVar5 = _archive_entry_copy_symlink_l(entry,local_78.s,local_78.length,lha->sconv);
    if (wVar5 == L'\0') goto LAB_002073b4;
    piVar14 = __errno_location();
    if (*piVar14 != 0xc) {
      pcVar10 = archive_string_conversion_charset_name(lha->sconv);
      archive_set_error(&a->archive,0x54,"Linkname cannot be converted from %s to current locale.",
                        pcVar10);
      wVar4 = L'\xffffffec';
      goto LAB_002073b4;
    }
    pcVar7 = "Can\'t allocate memory for Linkname";
  }
  else {
    piVar14 = __errno_location();
    if (*piVar14 != 0xc) {
      pcVar10 = archive_string_conversion_charset_name(lha->sconv);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar10);
      wVar4 = L'\xffffffec';
      goto LAB_002071aa;
    }
    pcVar7 = "Can\'t allocate memory for Pathname";
  }
  iVar18 = 0xc;
LAB_00206c1c:
  archive_set_error(&a->archive,iVar18,pcVar7);
  return L'\xffffffe2';
}

Assistant:

static int
archive_read_format_lha_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct archive_string linkname;
	struct archive_string pathname;
	struct lha *lha;
	const unsigned char *p;
	const char *signature;
	int err;
	
	a->archive.archive_format = ARCHIVE_FORMAT_LHA;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "lha";

	lha = (struct lha *)(a->format->data);
	lha->decompress_init = 0;
	lha->end_of_entry = 0;
	lha->end_of_entry_cleanup = 0;
	lha->entry_unconsumed = 0;

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL) {
		/*
		 * LHa archiver added 0 to the tail of its archive file as
		 * the mark of the end of the archive.
		 */
		signature = __archive_read_ahead(a, sizeof(signature[0]), NULL);
		if (signature == NULL || signature[0] == 0)
			return (ARCHIVE_EOF);
		return (truncated_error(a));
	}

	signature = (const char *)p;
	if (lha->found_first_header == 0 &&
	    signature[0] == 'M' && signature[1] == 'Z') {
                /* This is an executable?  Must be self-extracting... 	*/
		err = lha_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
		signature = (const char *)p;
	}
	/* signature[0] == 0 means the end of an LHa archive file. */
	if (signature[0] == 0)
		return (ARCHIVE_EOF);

	/*
	 * Check the header format and method type.
	 */
	if (lha_check_header_format(p) != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Bad LHa file");
		return (ARCHIVE_FATAL);
	}

	/* We've found the first header. */
	lha->found_first_header = 1;
	/* Set a default value and common data */
	lha->header_size = 0;
	lha->level = p[H_LEVEL_OFFSET];
	lha->method[0] = p[H_METHOD_OFFSET+1];
	lha->method[1] = p[H_METHOD_OFFSET+2];
	lha->method[2] = p[H_METHOD_OFFSET+3];
	if (memcmp(lha->method, "lhd", 3) == 0)
		lha->directory = 1;
	else
		lha->directory = 0;
	if (memcmp(lha->method, "lh0", 3) == 0 ||
	    memcmp(lha->method, "lz4", 3) == 0)
		lha->entry_is_compressed = 0;
	else
		lha->entry_is_compressed = 1;

	lha->compsize = 0;
	lha->origsize = 0;
	lha->setflag = 0;
	lha->birthtime = 0;
	lha->birthtime_tv_nsec = 0;
	lha->mtime = 0;
	lha->mtime_tv_nsec = 0;
	lha->atime = 0;
	lha->atime_tv_nsec = 0;
	lha->mode = (lha->directory)? 0777 : 0666;
	lha->uid = 0;
	lha->gid = 0;
	archive_string_empty(&lha->dirname);
	archive_string_empty(&lha->filename);
	lha->dos_attr = 0;
	if (lha->opt_sconv != NULL)
		lha->sconv = lha->opt_sconv;
	else
		lha->sconv = NULL;

	switch (p[H_LEVEL_OFFSET]) {
	case 0:
		err = lha_read_file_header_0(a, lha);
		break;
	case 1:
		err = lha_read_file_header_1(a, lha);
		break;
	case 2:
		err = lha_read_file_header_2(a, lha);
		break;
	case 3:
		err = lha_read_file_header_3(a, lha);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported LHa header level %d", p[H_LEVEL_OFFSET]);
		err = ARCHIVE_FATAL;
		break;
	}
	if (err < ARCHIVE_WARN)
		return (err);


	if (!lha->directory && archive_strlen(&lha->filename) == 0)
		/* The filename has not been set */
		return (truncated_error(a));

	/*
	 * Make a pathname from a dirname and a filename.
	 */
	archive_string_concat(&lha->dirname, &lha->filename);
	archive_string_init(&pathname);
	archive_string_init(&linkname);
	archive_string_copy(&pathname, &lha->dirname);

	if ((lha->mode & AE_IFMT) == AE_IFLNK) {
		/*
	 	 * Extract the symlink-name if it's included in the pathname.
	 	 */
		if (!lha_parse_linkname(&linkname, &pathname)) {
			/* We couldn't get the symlink-name. */
			archive_set_error(&a->archive,
		    	    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown symlink-name");
			archive_string_free(&pathname);
			archive_string_free(&linkname);
			return (ARCHIVE_FAILED);
		}
	} else {
		/*
		 * Make sure a file-type is set.
		 * The mode has been overridden if it is in the extended data.
		 */
		lha->mode = (lha->mode & ~AE_IFMT) |
		    ((lha->directory)? AE_IFDIR: AE_IFREG);
	}
	if ((lha->setflag & UNIX_MODE_IS_SET) == 0 &&
	    (lha->dos_attr & 1) != 0)
		lha->mode &= ~(0222);/* read only. */

	/*
	 * Set basic file parameters.
	 */
	if (archive_entry_copy_pathname_l(entry, pathname.s,
	    pathname.length, lha->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(lha->sconv));
		err = ARCHIVE_WARN;
	}
	archive_string_free(&pathname);
	if (archive_strlen(&linkname) > 0) {
		if (archive_entry_copy_symlink_l(entry, linkname.s,
		    linkname.length, lha->sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Linkname cannot be converted "
			    "from %s to current locale.",
			    archive_string_conversion_charset_name(lha->sconv));
			err = ARCHIVE_WARN;
		}
	} else
		archive_entry_set_symlink(entry, NULL);
	archive_string_free(&linkname);
	/*
	 * When a header level is 0, there is a possibility that
	 * a pathname and a symlink has '\' character, a directory
	 * separator in DOS/Windows. So we should convert it to '/'.
	 */
	if (p[H_LEVEL_OFFSET] == 0)
		lha_replace_path_separator(lha, entry);

	archive_entry_set_mode(entry, lha->mode);
	archive_entry_set_uid(entry, lha->uid);
	archive_entry_set_gid(entry, lha->gid);
	if (archive_strlen(&lha->uname) > 0)
		archive_entry_set_uname(entry, lha->uname.s);
	if (archive_strlen(&lha->gname) > 0)
		archive_entry_set_gname(entry, lha->gname.s);
	if (lha->setflag & BIRTHTIME_IS_SET) {
		archive_entry_set_birthtime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
		archive_entry_set_ctime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
	} else {
		archive_entry_unset_birthtime(entry);
		archive_entry_unset_ctime(entry);
	}
	archive_entry_set_mtime(entry, lha->mtime, lha->mtime_tv_nsec);
	if (lha->setflag & ATIME_IS_SET)
		archive_entry_set_atime(entry, lha->atime,
		    lha->atime_tv_nsec);
	else
		archive_entry_unset_atime(entry);
	if (lha->directory || archive_entry_symlink(entry) != NULL)
		archive_entry_unset_size(entry);
	else
		archive_entry_set_size(entry, lha->origsize);

	/*
	 * Prepare variables used to read a file content.
	 */
	lha->entry_bytes_remaining = lha->compsize;
	lha->entry_offset = 0;
	lha->entry_crc_calculated = 0;

	/*
	 * This file does not have a content.
	 */
	if (lha->directory || lha->compsize == 0)
		lha->end_of_entry = 1;

	sprintf(lha->format_name, "lha -%c%c%c-",
	    lha->method[0], lha->method[1], lha->method[2]);
	a->archive.archive_format_name = lha->format_name;

	return (err);
}